

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_vp8e_base.c
# Opt level: O1

void write_ivf_header(void *hal,RK_U8 *dst)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  long lVar5;
  undefined8 uVar6;
  
  lVar5 = *(long *)((long)hal + 0x70);
  uVar1 = *(undefined4 *)(lVar5 + 0xc);
  uVar2 = *(undefined4 *)(lVar5 + 0x10);
  uVar3 = *(undefined4 *)(lVar5 + 0xb8);
  uVar4 = *(undefined4 *)(lVar5 + 0xbc);
  uVar6 = *(undefined8 *)((long)hal + 0x6918);
  dst[0] = 'D';
  dst[1] = 'K';
  dst[2] = 'I';
  dst[3] = 'F';
  dst[4] = '\0';
  dst[5] = '\0';
  dst[6] = ' ';
  dst[7] = '\0';
  dst[8] = 'V';
  dst[9] = 'P';
  dst[10] = '8';
  dst[0xb] = '0';
  dst[0xc] = (RK_U8)uVar1;
  dst[0xd] = (RK_U8)((uint)uVar1 >> 8);
  dst[0xe] = (RK_U8)uVar2;
  dst[0xf] = (RK_U8)((uint)uVar2 >> 8);
  dst[0x10] = (RK_U8)uVar3;
  dst[0x11] = (RK_U8)((uint)uVar3 >> 8);
  dst[0x12] = (RK_U8)((uint)uVar3 >> 0x10);
  dst[0x13] = (RK_U8)((uint)uVar3 >> 0x18);
  dst[0x14] = (RK_U8)uVar4;
  dst[0x15] = (RK_U8)((uint)uVar4 >> 8);
  dst[0x16] = (RK_U8)((uint)uVar4 >> 0x10);
  dst[0x17] = (RK_U8)((uint)uVar4 >> 0x18);
  dst[0x18] = (RK_U8)uVar6;
  dst[0x19] = (RK_U8)((ulong)uVar6 >> 8);
  dst[0x1a] = (RK_U8)((ulong)uVar6 >> 0x10);
  dst[0x1b] = (RK_U8)((ulong)uVar6 >> 0x18);
  dst[0x1c] = '\0';
  dst[0x1d] = '\0';
  dst[0x1e] = '\0';
  dst[0x1f] = '\0';
  return;
}

Assistant:

void write_ivf_header(void *hal, RK_U8 *dst)
{
    RK_U8 data[IVF_HDR_BYTES] = {0};

    HalVp8eCtx *ctx = (HalVp8eCtx *)hal;

    MppEncPrepCfg *prep = &ctx->cfg->prep;
    MppEncRcCfg *rc = &ctx->cfg->rc;

    data[0] = 'D';
    data[1] = 'K';
    data[2] = 'I';
    data[3] = 'F';

    data[6] = 32;

    data[8] = 'V';
    data[9] = 'P';
    data[10] = '8';
    data[11] = '0';

    data[12] = prep->width & 0xff;
    data[13] = (prep->width >> 8) & 0xff;
    data[14] = prep->height & 0xff;
    data[15] = (prep->height >> 8) & 0xff;

    data[16] = rc->fps_out_num & 0xff;
    data[17] = (rc->fps_out_num >> 8) & 0xff;
    data[18] = (rc->fps_out_num >> 16) & 0xff;
    data[19] = (rc->fps_out_num >> 24) & 0xff;

    data[20] = rc->fps_out_denom & 0xff;
    data[21] = (rc->fps_out_denom >> 8) & 0xff;
    data[22] = (rc->fps_out_denom >> 16) & 0xff;
    data[23] = (rc->fps_out_denom >> 24) & 0xff;

    data[24] = ctx->frame_cnt & 0xff;
    data[25] = (ctx->frame_cnt >> 8) & 0xff;
    data[26] = (ctx->frame_cnt >> 16) & 0xff;
    data[27] = (ctx->frame_cnt >> 24) & 0xff;

    memcpy(dst, data, IVF_HDR_BYTES);
}